

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O0

ssize_t __thiscall QRingBuffer::read(QRingBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  QRingChunk *this_00;
  qsizetype qVar2;
  undefined4 in_register_00000034;
  QRingChunk *this_01;
  long in_FS_OFFSET;
  QList<QRingChunk> *in_stack_ffffffffffffff90;
  
  this_01 = (QRingChunk *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this_01->headOffset == 0) {
    QByteArray::QByteArray((QByteArray *)0x62c548);
  }
  else {
    this_00 = QList<QRingChunk>::constFirst(in_stack_ffffffffffffff90);
    qVar2 = QRingChunk::size(this_00);
    this_01->headOffset = this_01->headOffset - qVar2;
    QList<QRingChunk>::takeFirst((QList<QRingChunk> *)this_01);
    QRingChunk::toByteArray(this_01);
    QRingChunk::~QRingChunk((QRingChunk *)0x62c599);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (ssize_t)this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QRingBuffer::read()
{
    if (bufferSize == 0)
        return QByteArray();

    bufferSize -= buffers.constFirst().size();
    return buffers.takeFirst().toByteArray();
}